

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseFlag(char *str,char *flag_name,bool *value)

{
  char *pcVar1;
  byte *in_RDX;
  char *value_str;
  bool in_stack_0000006f;
  char *in_stack_00000070;
  char *in_stack_00000078;
  undefined1 local_29;
  undefined1 local_1;
  
  pcVar1 = ParseFlagValue(in_stack_00000078,in_stack_00000070,in_stack_0000006f);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else {
    local_29 = true;
    if ((*pcVar1 != '0') && (local_29 = true, *pcVar1 != 'f')) {
      local_29 = *pcVar1 == 'F';
    }
    *in_RDX = (local_29 ^ 0xffU) & 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool ParseFlag(const char* str, const char* flag_name, bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag_name, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}